

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::RenderTex2DCase::iterate(RenderTex2DCase *this)

{
  glBindRenderbufferFunc p_Var1;
  glBindTextureFunc p_Var2;
  glBindFramebufferFunc p_Var3;
  glFramebufferRenderbufferFunc p_Var4;
  glFramebufferTexture2DFunc p_Var5;
  int iVar6;
  deUint32 dVar7;
  RenderContext *context;
  undefined4 extraout_var;
  TestLog *log;
  char *description;
  ConstPixelBufferAccess local_188;
  ConstPixelBufferAccess local_160;
  undefined1 local_131;
  undefined1 local_130 [7];
  bool compareOk;
  PixelBufferAccess local_108;
  TextureFormat local_e0;
  undefined1 local_d8 [8];
  TextureLevel reference;
  undefined1 local_a8 [8];
  TextureLevel result;
  Texture depthStencilTex;
  undefined1 local_58 [8];
  Renderbuffer colorBuf;
  Framebuffer fbo;
  int height;
  int width;
  Functions *gl;
  RenderContext *renderCtx;
  RenderTex2DCase *this_local;
  Functions *gl_00;
  
  context = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar6 = (*context->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar6);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&colorBuf.super_ObjectWrapper.m_object,
             context);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)local_58,context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&result.m_data.m_cap,context);
  tcu::TextureFormat::TextureFormat((TextureFormat *)&reference.m_data.m_cap,RGBA,UNSIGNED_INT32);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)local_a8,(TextureFormat *)&reference.m_data.m_cap,0x75,0xc1,1);
  tcu::TextureFormat::TextureFormat(&local_e0,S,UNSIGNED_INT8);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_d8,&local_e0,0x75,0xc1,1);
  checkDepthStencilFormatSupport((this->super_TestCase).m_context,this->m_format);
  p_Var1 = gl_00->bindRenderbuffer;
  dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_58);
  (*p_Var1)(0x8d41,dVar7);
  (*gl_00->renderbufferStorage)(0x8d41,0x8236,0x75,0xc1);
  p_Var2 = gl_00->bindTexture;
  dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)&result.m_data.m_cap);
  (*p_Var2)(0xde1,dVar7);
  (*gl_00->texStorage2D)(0xde1,1,this->m_format,0x75,0xc1);
  p_Var3 = gl_00->bindFramebuffer;
  dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)&colorBuf.super_ObjectWrapper.m_object);
  (*p_Var3)(0x8d40,dVar7);
  p_Var4 = gl_00->framebufferRenderbuffer;
  dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_58);
  (*p_Var4)(0x8d40,0x8ce0,0x8d41,dVar7);
  p_Var5 = gl_00->framebufferTexture2D;
  dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)&result.m_data.m_cap);
  (*p_Var5)(0x8d40,0x821a,0xde1,dVar7,0);
  checkFramebufferStatus(gl_00);
  drawTestPattern(context,0x75,0xc1);
  (*gl_00->framebufferRenderbuffer)(0x8d40,0x821a,0x8d41,0);
  checkFramebufferStatus(gl_00);
  dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)&result.m_data.m_cap);
  blitStencilToColor2D(context,dVar7,0x75,0xc1);
  tcu::TextureLevel::getAccess(&local_108,(TextureLevel *)local_a8);
  glu::readPixels(context,0,0,&local_108);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_130,(TextureLevel *)local_d8)
  ;
  renderTestPatternReference((PixelBufferAccess *)local_130);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_160,(TextureLevel *)local_d8);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_188,(TextureLevel *)local_a8);
  local_131 = compareStencilToRed(log,&local_160,&local_188);
  description = "Image comparison failed";
  if ((bool)local_131) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~local_131 & QP_TEST_RESULT_FAIL,description);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_d8);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_a8);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&result.m_data.m_cap);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)local_58);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&colorBuf.super_ObjectWrapper.m_object);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&	renderCtx		= m_context.getRenderContext();
		const glw::Functions&		gl				= renderCtx.getFunctions();
		const int					width			= 117;
		const int					height			= 193;
		glu::Framebuffer			fbo				(renderCtx);
		glu::Renderbuffer			colorBuf		(renderCtx);
		glu::Texture				depthStencilTex	(renderCtx);
		TextureLevel				result			(TextureFormat(TextureFormat::RGBA, TextureFormat::UNSIGNED_INT32), width, height);
		TextureLevel				reference		(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8), width, height);

		checkDepthStencilFormatSupport(m_context, m_format);

		gl.bindRenderbuffer(GL_RENDERBUFFER, *colorBuf);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_R32UI, width, height);

		gl.bindTexture(GL_TEXTURE_2D, *depthStencilTex);
		gl.texStorage2D(GL_TEXTURE_2D, 1, m_format, width, height);

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorBuf);
		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_TEXTURE_2D, *depthStencilTex, 0);
		checkFramebufferStatus(gl);

		drawTestPattern(renderCtx, width, height);

		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_RENDERBUFFER, 0);
		checkFramebufferStatus(gl);

		blitStencilToColor2D(renderCtx, *depthStencilTex, width, height);
		glu::readPixels(renderCtx, 0, 0, result.getAccess());

		renderTestPatternReference(reference);

		{
			const bool compareOk = compareStencilToRed(m_testCtx.getLog(), reference, result);
			m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
									compareOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}